

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

uint64_t SSL_get_dtls_write_sequence(SSL *ssl,uint16_t epoch)

{
  DTLSWriteEpoch *pDVar1;
  uint64_t uVar2;
  
  if (ssl->method->is_dtls != false) {
    pDVar1 = bssl::dtls_get_write_epoch(ssl,epoch);
    if (pDVar1 == (DTLSWriteEpoch *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      uVar2 = (pDVar1->next_record).combined_ & 0xffffffffffff;
    }
    return uVar2;
  }
  abort();
}

Assistant:

uint64_t SSL_get_dtls_write_sequence(const SSL *ssl, uint16_t epoch) {
  BSSL_CHECK(SSL_is_dtls(ssl));
  const DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return UINT64_MAX;
  }
  return write_epoch->next_record.sequence();
}